

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O1

sexp sexp_make_foreign(sexp ctx,char *name,int num_args,int flags,char *fname,sexp_proc1 f,sexp data
                      )

{
  sexp psVar1;
  char cVar2;
  sexp res;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp local_58;
  sexp_proc1 local_50;
  sexp_gc_var_t local_48;
  
  local_48.var = &local_58;
  local_58 = (sexp)0x43e;
  local_48.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &local_48;
  local_50 = f;
  local_58 = sexp_alloc_tagged_aux(ctx,0x70,0x1b);
  (local_58->value).flonum_bits[0x58] = '\v';
  cVar2 = '\f';
  if (num_args < 5) {
    cVar2 = (char)num_args + '\a';
  }
  (local_58->value).flonum_bits[0x59] = cVar2;
  (local_58->value).flonum_bits[0x5a] = (char)num_args - ((byte)flags & 1);
  (local_58->value).opcode.flags = (byte)flags;
  psVar1 = sexp_c_string(ctx,name,-1);
  (local_58->value).type.name = psVar1;
  (local_58->value).type.cpl = data;
  (local_58->value).opcode.func = local_50;
  if (fname != (char *)0x0) {
    psVar1 = sexp_c_string(ctx,fname,-1);
    (local_58->value).type.slots = psVar1;
  }
  (local_58->value).opcode.dl = (sexp)(ctx->value).opcode.func;
  (ctx->value).context.saves = local_48.next;
  return local_58;
}

Assistant:

sexp sexp_make_foreign (sexp ctx, const char *name, int num_args,
                        int flags, const char *fname, sexp_proc1 f, sexp data) {
  sexp_gc_var1(res);
  sexp_gc_preserve1(ctx, res);
#if ! SEXP_USE_EXTENDED_FCALL
  if (num_args > 4)
    return sexp_user_exception(ctx, NULL, "make-foreign: exceeded foreign arg limit",
                               sexp_make_fixnum(num_args));
#endif
  res = sexp_alloc_type(ctx, opcode, SEXP_OPCODE);
  sexp_opcode_class(res) = SEXP_OPC_FOREIGN;
#if SEXP_USE_EXTENDED_FCALL
  if (num_args > 4)
    sexp_opcode_code(res) = SEXP_OP_FCALLN;
  else
#endif
    sexp_opcode_code(res) = SEXP_OP_FCALL1+num_args-1;
  if (flags & 1) num_args--;
  sexp_opcode_num_args(res) = num_args;
  sexp_opcode_flags(res) = flags;
  sexp_opcode_name(res) = sexp_c_string(ctx, name, -1);
  sexp_opcode_data(res) = data;
  sexp_opcode_func(res) = f;
  if (fname) {
    sexp_opcode_data2(res) = sexp_c_string(ctx, fname, -1);
  }
#if SEXP_USE_DL
  sexp_opcode_dl(res) = sexp_context_dl(ctx);
#endif
  sexp_gc_release1(ctx);
  return res;
}